

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

int QMetaTypeIdQObject<QSqlDatabase,_512>::qt_metatype_id(void)

{
  QBasicAtomicInt QVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1._q_value.super___atomic_base<int>._M_i =
       qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    pcVar2 = (char *)QMetaObject::className();
    QByteArray::QByteArray(&local_30,pcVar2,-1);
    QVar1._q_value.super___atomic_base<int>._M_i =
         (Type)qRegisterNormalizedMetaTypeImplementation<QSqlDatabase>(&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i =
       QVar1._q_value.super___atomic_base<int>._M_i;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (int)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *const cName = T::staticMetaObject.className();
        const int newId = qRegisterNormalizedMetaType<T>(cName);
        metatype_id.storeRelease(newId);
        return newId;
    }